

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

void __thiscall
ON_ObjRef::SetProxy(ON_ObjRef *this,ON_Object *proxy1,ON_Object *proxy2,bool bCountReferences)

{
  int *piVar1;
  
  if (((this->m__proxy1 != (ON_Object *)0x0) || (this->m__proxy2 != (ON_Object *)0x0)) ||
     (this->m__proxy_ref_count != (int *)0x0)) {
    DecrementProxyReferenceCount(this);
  }
  this->m__proxy1 = proxy1;
  this->m__proxy2 = proxy2;
  if ((bCountReferences) && (proxy1 != (ON_Object *)0x0 || proxy2 != (ON_Object *)0x0)) {
    piVar1 = (int *)onmalloc(4);
    this->m__proxy_ref_count = piVar1;
    *piVar1 = 1;
  }
  return;
}

Assistant:

void ON_ObjRef::SetProxy( 
          ON_Object* proxy1, 
          ON_Object* proxy2, 
          bool bCountReferences 
          )
{
  if ( m__proxy1 || m__proxy2 || m__proxy_ref_count )
  {
    // Remove any reference this ON_ObjRef class 
    // may currently have.
    DecrementProxyReferenceCount();
  }

  m__proxy1 = proxy1;
  m__proxy2 = proxy2;
  if ( bCountReferences && (m__proxy1 || m__proxy2) )
  {
    m__proxy_ref_count = (int*)onmalloc( sizeof(*m__proxy_ref_count) );
    *m__proxy_ref_count = 1;
  }
}